

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

void Hop_ObjDisconnect(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopObj.c"
                  ,0xa1,"void Hop_ObjDisconnect(Hop_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if (iVar1 != 0) {
    if (pObj->pFanin0 != (Hop_Obj_t *)0x0) {
      pHVar2 = Hop_ObjFanin0(pObj);
      Hop_ObjDeref(pHVar2);
    }
    if (pObj->pFanin1 != (Hop_Obj_t *)0x0) {
      pHVar2 = Hop_ObjFanin1(pObj);
      Hop_ObjDeref(pHVar2);
    }
    Hop_TableDelete(p,pObj);
    pObj->pFanin0 = (Hop_Obj_t *)0x0;
    pObj->pFanin1 = (Hop_Obj_t *)0x0;
    return;
  }
  __assert_fail("Hop_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopObj.c"
                ,0xa2,"void Hop_ObjDisconnect(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjDisconnect( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_ObjIsNode(pObj) );
    // remove connections
    if ( pObj->pFanin0 != NULL )
        Hop_ObjDeref(Hop_ObjFanin0(pObj));
    if ( pObj->pFanin1 != NULL )
        Hop_ObjDeref(Hop_ObjFanin1(pObj));
    // remove the node from the structural hash table
    Hop_TableDelete( p, pObj );
    // add the first fanin
    pObj->pFanin0 = NULL;
    pObj->pFanin1 = NULL;
}